

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong helper_dextr_s_h_mips64(target_ulong ac,target_ulong shift,CPUMIPSState_conflict5 *env)

{
  uint uVar1;
  ulong uStack_38;
  uint32_t temp127;
  int64_t temp [2];
  CPUMIPSState_conflict5 *env_local;
  target_ulong shift_local;
  target_ulong ac_local;
  
  mipsdsp_rashift_acc(&stack0xffffffffffffffc8,(uint32_t)ac,(uint)shift & 0x1f,env);
  uVar1 = (uint)(temp[0] >> 0x3f) & 1;
  if ((uVar1 == 0) && ((0 < temp[0] || (0x7fff < (long)uStack_38)))) {
    uStack_38 = uStack_38 & 0xffff0000 | 0x7fff;
    set_DSPControl_overflow_flag(1,0x17,env);
  }
  else if ((uVar1 == 1) && ((temp[0] != -1 || (uStack_38 < 0xffffffffffff1000)))) {
    uStack_38 = uStack_38 & 0xffff0000 | 0x8000;
    set_DSPControl_overflow_flag(1,0x17,env);
  }
  return (long)(short)uStack_38;
}

Assistant:

target_ulong helper_dextr_s_h(target_ulong ac, target_ulong shift,
                              CPUMIPSState *env)
{
    int64_t temp[2];
    uint32_t temp127;

    shift = shift & 0x1F;

    mipsdsp_rashift_acc((uint64_t *)temp, ac, shift, env);

    temp127 = (temp[1] >> 63) & 0x01;

    if ((temp127 == 0) && (temp[1] > 0 || temp[0] > 32767)) {
        temp[0] &= 0xFFFF0000;
        temp[0] |= 0x00007FFF;
        set_DSPControl_overflow_flag(1, 23, env);
    } else if ((temp127 == 1) &&
            (temp[1] < 0xFFFFFFFFFFFFFFFFll
             || temp[0] < 0xFFFFFFFFFFFF1000ll)) {
        temp[0] &= 0xFFFF0000;
        temp[0] |= 0x00008000;
        set_DSPControl_overflow_flag(1, 23, env);
    }

    return (int64_t)(int16_t)(temp[0] & MIPSDSP_LO);
}